

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O0

void __thiscall
EDCircles::DetectArcs(EDCircles *this,vector<LineSegment,_std::allocator<LineSegment>_> *lines)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  double dVar5;
  bool local_205;
  int local_1f4;
  double local_1e0;
  double eTheta_2;
  double sTheta_2;
  double coverage_1;
  double error;
  double r;
  double yc_1;
  double xc_1;
  int local_1a0;
  int noPixelsSave;
  int index_3;
  int m_4;
  int m_3;
  bool found;
  double Error;
  double R;
  double YC;
  double XC;
  int curLine;
  int m_2;
  double eTheta_1;
  double sTheta_1;
  double dStack_150;
  bool valid;
  double ellipseFitError;
  EllipseEquation eq;
  bool isAlmostClosedLoop;
  double distanceBetweenEndPoints;
  double dy;
  double dx;
  double dStack_e8;
  int m_1;
  double eTheta;
  double sTheta;
  double MYERROR;
  double coverage;
  double circleFitError;
  double radius;
  double yc;
  double xc;
  int local_a0;
  int n_2;
  int index_2;
  int n_1;
  int index_1;
  int m;
  int n;
  int index;
  double *y;
  double *x;
  int local_70;
  int noPixels;
  int longerLen;
  int shorterLen;
  int totalLineLength;
  int wrapCase;
  int iStack_58;
  bool specialCase;
  int lastLine;
  int stopLine;
  int firstLine;
  int curSegmentNo;
  int iter;
  double MAX_ANGLE;
  double MIN_ANGLE;
  double maxLineLengthThreshold;
  vector<LineSegment,_std::allocator<LineSegment>_> *lines_local;
  EDCircles *this_local;
  
  if ((this->super_EDPF).super_ED.width < (this->super_EDPF).super_ED.height) {
    local_1f4 = (this->super_EDPF).super_ED.height;
  }
  else {
    local_1f4 = (this->super_EDPF).super_ED.width;
  }
  MIN_ANGLE = (double)(local_1f4 / 5);
  MAX_ANGLE = 0.10471975511965977;
  _curSegmentNo = 1.0471975511965976;
  firstLine = 1;
  maxLineLengthThreshold = (double)lines;
  lines_local = (vector<LineSegment,_std::allocator<LineSegment>_> *)this;
  do {
    if (2 < firstLine) {
      return;
    }
    if (firstLine == 2) {
      _curSegmentNo = 1.6534698176788385;
    }
    for (stopLine = 0; stopLine < (this->super_EDPF).super_ED.segmentNos; stopLine = stopLine + 1) {
      lastLine = this->segmentStartLines[stopLine];
      iStack_58 = this->segmentStartLines[stopLine + 1];
      if (1 < iStack_58 - lastLine) {
LAB_001163e4:
        if (lastLine < iStack_58 + -1) {
          if ((this->info[lastLine].taken & 1U) == 0) {
            pvVar2 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                               (lines,(long)lastLine);
            if ((double)pvVar2->len < MIN_ANGLE) {
              if ((this->info[lastLine].angle < MAX_ANGLE) ||
                 (iVar1 = lastLine, _curSegmentNo < this->info[lastLine].angle)) {
                lastLine = lastLine + 1;
                goto LAB_001163e4;
              }
              while (wrapCase = iVar1 + 1, wrapCase < iStack_58 + -1) {
                if (((((this->info[wrapCase].taken & 1U) != 0) ||
                     (this->info[wrapCase].sign != this->info[lastLine].sign)) ||
                    (pvVar2 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                                        (lines,(long)wrapCase), MIN_ANGLE <= (double)pvVar2->len))
                   || ((this->info[wrapCase].angle < MAX_ANGLE ||
                       (iVar1 = wrapCase, _curSegmentNo < this->info[wrapCase].angle)))) break;
              }
              totalLineLength._3_1_ = 0;
              shorterLen = -1;
              if (wrapCase - lastLine == 1) {
                pvVar2 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                                   (lines,(long)lastLine);
                iVar1 = pvVar2->len;
                pvVar2 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                                   (lines,(long)(lastLine + 1));
                longerLen = iVar1 + pvVar2->len;
                pvVar2 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                                   (lines,(long)lastLine);
                noPixels = pvVar2->len;
                pvVar2 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                                   (lines,(long)(lastLine + 1));
                local_70 = pvVar2->len;
                pvVar2 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                                   (lines,(long)(lastLine + 1));
                if (pvVar2->len < noPixels) {
                  pvVar2 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                                     (lines,(long)(lastLine + 1));
                  noPixels = pvVar2->len;
                  pvVar2 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                                     (lines,(long)lastLine);
                  local_70 = pvVar2->len;
                }
                if (((0.2617993877991494 <= this->info[lastLine].angle) &&
                    (this->info[lastLine].angle <= 0.7853981633974483)) &&
                   ((0x27 < longerLen && (local_70 <= noPixels * 2)))) {
                  totalLineLength._3_1_ = 1;
                }
                if ((totalLineLength._3_1_ & 1) == 0) {
                  if (((lastLine != this->segmentStartLines[stopLine]) ||
                      (this->info[iStack_58 + -1].angle < MAX_ANGLE)) ||
                     (_curSegmentNo < this->info[iStack_58 + -1].angle)) {
                    if (((wrapCase == iStack_58 + -1) && (MAX_ANGLE <= this->info[wrapCase].angle))
                       && (this->info[wrapCase].angle <= _curSegmentNo)) {
                      shorterLen = 2;
                      totalLineLength._3_1_ = 1;
                    }
                  }
                  else {
                    shorterLen = 1;
                    totalLineLength._3_1_ = 1;
                  }
                }
                if ((totalLineLength._3_1_ & 1) == 0) {
                  lastLine = wrapCase;
                  goto LAB_001163e4;
                }
              }
              x._4_4_ = 0;
              y = BufferManager::getX(this->bm);
              _n = BufferManager::getY(this->bm);
              if (shorterLen == 1) {
                pvVar2 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                                   (lines,(long)(iStack_58 + -1));
                m = pvVar2->firstPixelIndex;
                for (index_1 = 0; iVar1 = index_1,
                    pvVar2 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                                       (lines,(long)(iStack_58 + -1)), iVar1 < pvVar2->len;
                    index_1 = index_1 + 1) {
                  pvVar3 = std::
                           vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                           ::operator[](&(this->super_EDPF).super_ED.segmentPoints,(long)stopLine);
                  pvVar4 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::
                           operator[](pvVar3,(long)(m + index_1));
                  y[x._4_4_] = (double)pvVar4->x;
                  pvVar3 = std::
                           vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                           ::operator[](&(this->super_EDPF).super_ED.segmentPoints,(long)stopLine);
                  pvVar4 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::
                           operator[](pvVar3,(long)(m + index_1));
                  _n[x._4_4_] = (double)pvVar4->y;
                  x._4_4_ = x._4_4_ + 1;
                }
              }
              for (n_1 = lastLine; n_1 <= wrapCase; n_1 = n_1 + 1) {
                pvVar2 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                                   (lines,(long)n_1);
                index_2 = pvVar2->firstPixelIndex;
                for (n_2 = 0; iVar1 = n_2,
                    pvVar2 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                                       (lines,(long)n_1), iVar1 < pvVar2->len; n_2 = n_2 + 1) {
                  pvVar3 = std::
                           vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                           ::operator[](&(this->super_EDPF).super_ED.segmentPoints,(long)stopLine);
                  pvVar4 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::
                           operator[](pvVar3,(long)(index_2 + n_2));
                  y[x._4_4_] = (double)pvVar4->x;
                  pvVar3 = std::
                           vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                           ::operator[](&(this->super_EDPF).super_ED.segmentPoints,(long)stopLine);
                  pvVar4 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::
                           operator[](pvVar3,(long)(index_2 + n_2));
                  _n[x._4_4_] = (double)pvVar4->y;
                  x._4_4_ = x._4_4_ + 1;
                }
              }
              if (shorterLen == 2) {
                pvVar2 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                                   (lines,(long)this->segmentStartLines[stopLine]);
                local_a0 = pvVar2->firstPixelIndex;
                for (xc._4_4_ = 0; iVar1 = xc._4_4_,
                    pvVar2 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                                       (lines,(long)this->segmentStartLines[stopLine]),
                    iVar1 < pvVar2->len; xc._4_4_ = xc._4_4_ + 1) {
                  pvVar3 = std::
                           vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                           ::operator[](&(this->super_EDPF).super_ED.segmentPoints,(long)stopLine);
                  pvVar4 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::
                           operator[](pvVar3,(long)(local_a0 + xc._4_4_));
                  y[x._4_4_] = (double)pvVar4->x;
                  pvVar3 = std::
                           vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                           ::operator[](&(this->super_EDPF).super_ED.segmentPoints,(long)stopLine);
                  pvVar4 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::
                           operator[](pvVar3,(long)(local_a0 + xc._4_4_));
                  _n[x._4_4_] = (double)pvVar4->y;
                  x._4_4_ = x._4_4_ + 1;
                }
              }
              BufferManager::move(this->bm,x._4_4_);
              CircleFit(y,_n,x._4_4_,&yc,&radius,&circleFitError,&coverage);
              MYERROR = (double)x._4_4_ / (circleFitError * 6.283185307179586);
              if (((totalLineLength._3_1_ & 1) != 0) && (MYERROR < 0.0625)) {
                this->info[lastLine].taken = true;
                lastLine = wrapCase;
                goto LAB_001163e4;
              }
              sTheta = 1.0;
              if (2 < wrapCase - lastLine) {
                sTheta = 1.5;
              }
              if (coverage <= sTheta) {
                if (shorterLen == 1) {
                  pvVar2 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                                     (lines,(long)(iStack_58 + -1));
                  y = y + pvVar2->len;
                  pvVar2 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                                     (lines,(long)(iStack_58 + -1));
                  _n = _n + pvVar2->len;
                  pvVar2 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                                     (lines,(long)(iStack_58 + -1));
                  x._4_4_ = x._4_4_ - pvVar2->len;
                }
                else if (shorterLen == 2) {
                  pvVar2 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                                     (lines,(long)this->segmentStartLines[stopLine]);
                  x._4_4_ = x._4_4_ - pvVar2->len;
                }
                if ((MYERROR < 0.67) || (1.5 < coverage)) {
                  ComputeStartAndEndAngles
                            (yc,radius,circleFitError,y,_n,x._4_4_,&eTheta,&stack0xffffffffffffff18)
                  ;
                  addArc(this->edarcs1->arcs,&this->edarcs1->noArcs,yc,radius,circleFitError,
                         coverage,eTheta,dStack_e8,this->info[lastLine].sign,stopLine,(int)*y,
                         (int)*_n,(int)y[x._4_4_ + -1],(int)_n[x._4_4_ + -1],y,_n,x._4_4_,0.0);
                }
                else {
                  addCircle(this->circles1,&this->noCircles1,yc,radius,circleFitError,coverage,y,_n,
                            x._4_4_);
                }
                for (dx._4_4_ = lastLine; dx._4_4_ < wrapCase; dx._4_4_ = dx._4_4_ + 1) {
                  this->info[dx._4_4_].taken = true;
                }
                lastLine = wrapCase;
                goto LAB_001163e4;
              }
              dVar5 = sqrt((*y - y[x._4_4_ + -1]) * (*y - y[x._4_4_ + -1]) +
                           (*_n - _n[x._4_4_ + -1]) * (*_n - _n[x._4_4_ + -1]));
              local_205 = dVar5 <= circleFitError * 1.72 && 0.67 <= MYERROR;
              eq.coeff[6]._7_1_ = local_205;
              if ((local_205) || ((firstLine == 1 && (0.25 <= MYERROR)))) {
                EllipseEquation::EllipseEquation((EllipseEquation *)&ellipseFitError);
                dStack_150 = 10000000000.0;
                sTheta_1._7_1_ = EllipseFit(y,_n,x._4_4_,(EllipseEquation *)&ellipseFitError,1);
                if ((bool)sTheta_1._7_1_) {
                  dStack_150 = ComputeEllipseError((EllipseEquation *)&ellipseFitError,y,_n,x._4_4_)
                  ;
                }
                sTheta = 1.5;
                if ((eq.coeff[6]._7_1_ & 1) == 0) {
                  sTheta = 0.75;
                }
                if (dStack_150 <= sTheta) {
                  if (shorterLen == 1) {
                    pvVar2 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                                       (lines,(long)(iStack_58 + -1));
                    y = y + pvVar2->len;
                    pvVar2 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                                       (lines,(long)(iStack_58 + -1));
                    _n = _n + pvVar2->len;
                    pvVar2 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                                       (lines,(long)(iStack_58 + -1));
                    x._4_4_ = x._4_4_ - pvVar2->len;
                  }
                  else if (shorterLen == 2) {
                    pvVar2 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                                       (lines,(long)this->segmentStartLines[stopLine]);
                    x._4_4_ = x._4_4_ - pvVar2->len;
                  }
                  if ((eq.coeff[6]._7_1_ & 1) == 0) {
                    ComputeStartAndEndAngles
                              (yc,radius,circleFitError,y,_n,x._4_4_,&eTheta_1,(double *)&curLine);
                    addArc(this->edarcs1->arcs,&this->edarcs1->noArcs,yc,radius,circleFitError,
                           coverage,eTheta_1,_curLine,this->info[lastLine].sign,stopLine,
                           (EllipseEquation *)&ellipseFitError,dStack_150,(int)*y,(int)*_n,
                           (int)y[x._4_4_ + -1],(int)_n[x._4_4_ + -1],y,_n,x._4_4_,0.0);
                  }
                  else {
                    addCircle(this->circles1,&this->noCircles1,yc,radius,circleFitError,coverage,
                              (EllipseEquation *)&ellipseFitError,dStack_150,y,_n,x._4_4_);
                  }
                  for (XC._4_4_ = lastLine; XC._4_4_ < wrapCase; XC._4_4_ = XC._4_4_ + 1) {
                    this->info[XC._4_4_].taken = true;
                  }
                  lastLine = wrapCase;
                  goto LAB_001163e4;
                }
              }
              if ((totalLineLength._3_1_ & 1) == 0) {
                while (lastLine <= wrapCase + -2) {
                  _m_3 = 10000000000.0;
                  m_4._3_1_ = 0;
                  x._4_4_ = 0;
                  for (XC._0_4_ = lastLine + 2; XC._0_4_ <= wrapCase; XC._0_4_ = XC._0_4_ + 1) {
                    x._4_4_ = 0;
                    for (index_3 = lastLine; index_3 <= XC._0_4_; index_3 = index_3 + 1) {
                      pvVar2 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                                         (lines,(long)index_3);
                      x._4_4_ = pvVar2->len + x._4_4_;
                    }
                    CircleFit(y,_n,x._4_4_,&YC,&R,&Error,(double *)&m_3);
                    if (_m_3 <= 1.0) {
                      m_4._3_1_ = 1;
                      break;
                    }
                    pvVar2 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                                       (lines,(long)lastLine);
                    y = y + pvVar2->len;
                    pvVar2 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                                       (lines,(long)lastLine);
                    _n = _n + pvVar2->len;
                    lastLine = lastLine + 1;
                  }
                  if ((m_4._3_1_ & 1) == 0) break;
                  for (noPixelsSave = XC._0_4_ + -2; noPixelsSave <= XC._0_4_;
                      noPixelsSave = noPixelsSave + 1) {
                    this->info[noPixelsSave].taken = true;
                  }
                  while (XC._0_4_ = XC._0_4_ + 1, XC._0_4_ <= wrapCase) {
                    pvVar2 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                                       (lines,(long)XC._0_4_);
                    local_1a0 = pvVar2->firstPixelIndex;
                    xc_1._4_4_ = x._4_4_;
                    pvVar2 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                                       (lines,(long)XC._0_4_);
                    x._4_4_ = pvVar2->len + x._4_4_;
                    CircleFit(y,_n,x._4_4_,&yc_1,&r,&error,&coverage_1);
                    if (1.5 < coverage_1) {
                      x._4_4_ = xc_1._4_4_;
                      break;
                    }
                    YC = yc_1;
                    R = r;
                    Error = error;
                    _m_3 = coverage_1;
                    this->info[XC._0_4_].taken = true;
                  }
                  sTheta_2 = (double)x._4_4_ / (circleFitError * 6.283185307179586);
                  if ((sTheta_2 < 0.67) || (1.5 < coverage)) {
                    ComputeStartAndEndAngles(YC,R,Error,y,_n,x._4_4_,&eTheta_2,&local_1e0);
                    addArc(this->edarcs1->arcs,&this->edarcs1->noArcs,YC,R,Error,_m_3,eTheta_2,
                           local_1e0,this->info[lastLine].sign,stopLine,(int)*y,(int)*_n,
                           (int)y[x._4_4_ + -1],(int)_n[x._4_4_ + -1],y,_n,x._4_4_,0.0);
                  }
                  else {
                    addCircle(this->circles1,&this->noCircles1,YC,R,Error,_m_3,y,_n,x._4_4_);
                  }
                  y = y + x._4_4_;
                  _n = _n + x._4_4_;
                  lastLine = XC._0_4_;
                }
                lastLine = wrapCase;
              }
              else {
                this->info[lastLine].taken = true;
                lastLine = wrapCase;
              }
              goto LAB_001163e4;
            }
            lastLine = lastLine + 1;
          }
          else {
            lastLine = lastLine + 1;
          }
          goto LAB_001163e4;
        }
      }
    }
    firstLine = firstLine + 1;
  } while( true );
}

Assistant:

void EDCircles::DetectArcs(vector<LineSegment> lines)
{

	double maxLineLengthThreshold = MAX(width, height) / 5;

	double MIN_ANGLE = PI / 30;  // 6 degrees
	double MAX_ANGLE = PI / 3;   // 60 degrees

	for (int iter = 1; iter <= 2; iter++) {
		if (iter == 2) MAX_ANGLE = PI / 1.9;  // 95 degrees
											  //    if (iter == 2) MAX_ANGLE = PI/2.25;  // 80 degrees

		for (int curSegmentNo = 0; curSegmentNo<segmentNos; curSegmentNo++) {
			int firstLine = segmentStartLines[curSegmentNo];
			int stopLine = segmentStartLines[curSegmentNo + 1];

			// We need at least 2 line segments
			if (stopLine - firstLine <= 1) continue;

			// Process the info for the lines of this segment
			while (firstLine < stopLine - 1) {
				// If the line is already taken during the previous step, continue
				if (info[firstLine].taken) { firstLine++; continue; }

				// very long lines cannot be part of an arc
				if (lines[firstLine].len >= maxLineLengthThreshold) { firstLine++; continue; }

				// Skip lines that cannot be part of an arc
				if (info[firstLine].angle < MIN_ANGLE || info[firstLine].angle > MAX_ANGLE) { firstLine++; continue; }

				// Find a group of lines (at least 3) with the same sign & angle < MAX_ANGLE degrees
				int lastLine = firstLine + 1;
				while (lastLine < stopLine - 1) {
					if (info[lastLine].taken) break;
					if (info[lastLine].sign != info[firstLine].sign) break;

					if (lines[lastLine].len >= maxLineLengthThreshold) break; // very long lines cannot be part of an arc
					if (info[lastLine].angle < MIN_ANGLE) break;
					if (info[lastLine].angle > MAX_ANGLE) break;

					lastLine++;
				} //end-while

				bool specialCase = false;
				int wrapCase = -1;  // 1: wrap the first two lines with the last line, 2: wrap the last two lines with the first line
#if 0
									// If we do not have 3 lines, then continue
				if (lastLine - firstLine <= 1) { firstLine = lastLine; continue; }
#else
									//        if (lastLine-firstLine == 0){firstLine=lastLine; continue;}
				if (lastLine - firstLine == 1) {
					// Just 2 lines. If long enough, then try to combine. Angle between 15 & 45 degrees. Min. length = 40
					int totalLineLength = lines[firstLine].len + lines[firstLine + 1].len;
					int shorterLen = lines[firstLine].len;
					int longerLen = lines[firstLine + 1].len;

					if (lines[firstLine + 1].len < shorterLen) {
						shorterLen = lines[firstLine + 1].len;
						longerLen = lines[firstLine].len;
					} //end-if

					if (info[firstLine].angle >= PI / 12 && info[firstLine].angle <= PI / 4 && totalLineLength >= 40 && shorterLen * 2 >= longerLen) {
						specialCase = true;
					} //end-if

					  // If the two lines do not make up for arc generation, then try to wrap the lines to the first OR last line.
					  // There are two wrapper cases: 
					if (specialCase == false) {
						// Case 1: Combine the first two lines with the last line of the segment
						if (firstLine == segmentStartLines[curSegmentNo] && info[stopLine - 1].angle >= MIN_ANGLE && info[stopLine - 1].angle <= MAX_ANGLE) {
							wrapCase = 1;
							specialCase = true;
						} //end-if            

						  // Case 2: Combine the last two lines with the first line of the segment
						else if (lastLine == stopLine - 1 && info[lastLine].angle >= MIN_ANGLE && info[lastLine].angle <= MAX_ANGLE) {
							wrapCase = 2;
							specialCase = true;
						} //end-if            
					} // end-if

					  // If still not enough for arc generation, then skip
					if (specialCase == false) {
						firstLine = lastLine;
						continue;
					} //end-else
				} //end-if
#endif

				  // Copy the pixels of this segment to an array
				int noPixels = 0;
				double *x = bm->getX();
				double *y = bm->getY();

				// wrapCase 1: Combine the first two lines with the last line of the segment
				if (wrapCase == 1) {
					int index = lines[stopLine - 1].firstPixelIndex;

					for (int n = 0; n<lines[stopLine - 1].len; n++) {
						x[noPixels] = segmentPoints[curSegmentNo][index + n].x;
						y[noPixels] = segmentPoints[curSegmentNo][index + n].y;
						noPixels++;
					} //end-for
				} //end-if

				for (int m = firstLine; m <= lastLine; m++) {
					int index = lines[m].firstPixelIndex;

					for (int n = 0; n<lines[m].len; n++) {
						x[noPixels] = segmentPoints[curSegmentNo][index + n].x;
						y[noPixels] = segmentPoints[curSegmentNo][index + n].y;
						noPixels++;
					} //end-for
				} //end-for

				  // wrapCase 2: Combine the last two lines with the first line of the segment
				if (wrapCase == 2) {
					int index = lines[segmentStartLines[curSegmentNo]].firstPixelIndex;

					for (int n = 0; n<lines[segmentStartLines[curSegmentNo]].len; n++) {
						x[noPixels] = segmentPoints[curSegmentNo][index + n].x;
						y[noPixels] = segmentPoints[curSegmentNo][index + n].y;
						noPixels++;
					} //end-for
				} //end-if

				  // Move buffer pointers
				bm->move(noPixels);

				// Try to fit a circle to the entire arc of lines
				double xc, yc, radius, circleFitError;
				CircleFit(x, y, noPixels, &xc, &yc, &radius, &circleFitError);

				double coverage = noPixels / (TWOPI*radius);

				// In the case of the special case, the arc must cover at least 22.5 degrees
				if (specialCase && coverage < 1.0 / 16) { info[firstLine].taken = true; firstLine = lastLine; continue; }

				// If only 3 lines, use the SHORT_ARC_ERROR
				double MYERROR = SHORT_ARC_ERROR;
				if (lastLine - firstLine >= 3) MYERROR = LONG_ARC_ERROR;
				if (circleFitError <= MYERROR) {
					// Add this to the list of arcs
					if (wrapCase == 1) {
						x += lines[stopLine - 1].len;
						y += lines[stopLine - 1].len;
						noPixels -= lines[stopLine - 1].len;

					}
					else if (wrapCase == 2) {
						noPixels -= lines[segmentStartLines[curSegmentNo]].len;
					} //end-else

					if ((coverage >= FULL_CIRCLE_RATIO && circleFitError <= LONG_ARC_ERROR)) {
						addCircle(circles1, noCircles1, xc, yc, radius, circleFitError, x, y, noPixels);

					}
					else {
						double sTheta, eTheta;
						ComputeStartAndEndAngles(xc, yc, radius, x, y, noPixels, &sTheta, &eTheta);

						addArc(edarcs1->arcs, edarcs1->noArcs, xc, yc, radius, circleFitError, sTheta, eTheta, info[firstLine].sign, curSegmentNo,
							(int)x[0], (int)y[0], (int)x[noPixels - 1], (int)y[noPixels - 1], x, y, noPixels);
					} //end-else

					for (int m = firstLine; m<lastLine; m++) info[m].taken = true;
					firstLine = lastLine;
					continue;
				} //end-if

				  // Check if this is an almost closed loop (i.e, if 60% of the circle is present). If so, try to fit an ellipse to the entire arc of lines
				double dx = x[0] - x[noPixels - 1];
				double dy = y[0] - y[noPixels - 1];
				double distanceBetweenEndPoints = sqrt(dx*dx + dy*dy);

				bool isAlmostClosedLoop = (distanceBetweenEndPoints <= 1.72*radius && coverage >= FULL_CIRCLE_RATIO);
				if (isAlmostClosedLoop || (iter == 1 && coverage >= 0.25)) {  // an arc covering at least 90 degrees
					EllipseEquation eq;
					double ellipseFitError = 1e10;

					bool valid = EllipseFit(x, y, noPixels, &eq);
					if (valid) ellipseFitError = ComputeEllipseError(&eq, x, y, noPixels);

					MYERROR = ELLIPSE_ERROR;
					if (isAlmostClosedLoop == false) MYERROR = 0.75;

					if (ellipseFitError <= MYERROR) {
						// Add this to the list of arcs
						if (wrapCase == 1) {
							x += lines[stopLine - 1].len;
							y += lines[stopLine - 1].len;
							noPixels -= lines[stopLine - 1].len;

						}
						else if (wrapCase == 2) {
							noPixels -= lines[segmentStartLines[curSegmentNo]].len;
						} //end-else

						if (isAlmostClosedLoop) {
							addCircle(circles1, noCircles1, xc, yc, radius, circleFitError, &eq, ellipseFitError, x, y, noPixels);  // Add an ellipse for validation

						}
						else {
							double sTheta, eTheta;
							ComputeStartAndEndAngles(xc, yc, radius, x, y, noPixels, &sTheta, &eTheta);

							addArc(edarcs1->arcs, edarcs1->noArcs,  xc, yc, radius, circleFitError, sTheta, eTheta, info[firstLine].sign, curSegmentNo, &eq, ellipseFitError,
								(int)x[0], (int)y[0], (int)x[noPixels - 1], (int)y[noPixels - 1], x, y, noPixels);
						} //end-else

						for (int m = firstLine; m<lastLine; m++) info[m].taken = true;
						firstLine = lastLine;
						continue;
					} //end-if
				} //end-if

				if (specialCase) { info[firstLine].taken = true; firstLine = lastLine; continue; }

				// Continue until we finish all lines that belong to arc of lines
				while (firstLine <= lastLine - 2) {
					// Fit an initial arc and extend it
					int curLine = firstLine + 2;

					// Fit a circle to the pixels of these lines and see if the error is less than a threshold
					double XC, YC, R, Error = 1e10;
					bool found = false;

					noPixels = 0;
					while (curLine <= lastLine) {
						noPixels = 0;
						for (int m = firstLine; m <= curLine; m++) noPixels += lines[m].len;

						// Fit circle
						CircleFit(x, y, noPixels, &XC, &YC, &R, &Error);
						if (Error <= SHORT_ARC_ERROR) { found = true; break; } // found if the error is smaller than the threshold

																			   // Not found. Move to the next set of lines
						x += lines[firstLine].len;
						y += lines[firstLine].len;

						firstLine++;
						curLine++;
					} //end-while

					  // If no initial arc found, then we are done with this arc of lines
					if (!found) break;

					// If we found an initial arc, then extend it
					for (int m = curLine - 2; m <= curLine; m++) info[m].taken = true;
					curLine++;
					while (curLine <= lastLine) {
						int index = lines[curLine].firstPixelIndex;
						int noPixelsSave = noPixels;

						noPixels += lines[curLine].len;

						double xc, yc, r, error;
						CircleFit(x, y, noPixels, &xc, &yc, &r, &error);
						if (error > LONG_ARC_ERROR) { noPixels = noPixelsSave; break; }   // Adding this line made the error big. So, we do not use this line

																						  // OK. Longer arc
						XC = xc;
						YC = yc;
						R = r;
						Error = error;

						info[curLine].taken = true;
						curLine++;
					} //end-while

					double coverage = noPixels / (TWOPI*radius);
					if ((coverage >= FULL_CIRCLE_RATIO && circleFitError <= LONG_ARC_ERROR)) {
						addCircle(circles1, noCircles1, XC, YC, R, Error, x, y, noPixels);

					}
					else {
						// Add this to the list of arcs
						double sTheta, eTheta;
						ComputeStartAndEndAngles(XC, YC, R, x, y, noPixels, &sTheta, &eTheta);

						addArc(edarcs1->arcs, edarcs1->noArcs, XC, YC, R, Error, sTheta, eTheta, info[firstLine].sign, curSegmentNo,
							(int)x[0], (int)y[0], (int)x[noPixels - 1], (int)y[noPixels - 1], x, y, noPixels);
					} //end-else

					x += noPixels;
					y += noPixels;

					firstLine = curLine;
				} //end-while-current-arc-of-lines

				firstLine = lastLine;
			} //end-while-entire-edge-segment
		} //end-for
	} //end-for-iter
}